

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::TypedExpectation<test_result_(fmt::v5::basic_string_view<wchar_t>)>::
TypedExpectation(TypedExpectation<test_result_(fmt::v5::basic_string_view<wchar_t>)> *this,
                FunctionMockerBase<test_result_(fmt::v5::basic_string_view<wchar_t>)> *owner,
                char *a_file,int a_line,string *a_source_text,ArgumentMatcherTuple *m)

{
  undefined4 in_ECX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  undefined8 in_R9;
  DoDefaultAction *in_stack_ffffffffffffff98;
  tuple<testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
  *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  
  ExpectationBase::ExpectationBase
            ((ExpectationBase *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,
             (int)((ulong)in_R9 >> 0x20),in_stack_ffffffffffffffc8);
  *in_RDI = &PTR__TypedExpectation_00269c98;
  in_RDI[0x1d] = in_RSI;
  std::tr1::
  tuple<testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
  ::tuple(in_stack_ffffffffffffffa0,
          (tuple<testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
           *)in_stack_ffffffffffffff98);
  A<std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,void,void,void,void,void,void,void,void,void>const&>
            ();
  DoDefault();
  DoDefaultAction::operator_cast_to_Action(in_stack_ffffffffffffff98);
  return;
}

Assistant:

TypedExpectation(FunctionMockerBase<F>* owner,
                   const char* a_file, int a_line, const string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}